

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagHelperMethodWrapper.cpp
# Opt level: O3

Var __thiscall
Js::HelperMethodWrapper1(Js *this,ScriptContext *scriptContext,void *origHelperAddr,Var arg1)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Var pvVar4;
  char *pcVar5;
  anon_class_16_2_a2bd5e14 fn;
  
  pcVar5 = (char *)arg1;
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    pcVar5 = "origHelperAddr";
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagHelperMethodWrapper.cpp"
                                ,0x52,"(origHelperAddr)","origHelperAddr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    scriptContext = (ScriptContext *)0x0;
  }
  fn.arg1 = pcVar5;
  fn.origHelperAddr = origHelperAddr;
  pvVar4 = HelperMethodWrapper<Js::HelperMethodWrapper1(Js::ScriptContext*,void*,void*)::__0>
                     (this,scriptContext,fn);
  return pvVar4;
}

Assistant:

Var HelperMethodWrapper1(ScriptContext* scriptContext, void* origHelperAddr, Var arg1)
    {
        Assert(origHelperAddr);
        return HelperMethodWrapper(scriptContext, [=] {
            return ((OrigHelperMethod1)origHelperAddr)(arg1);
        });
    }